

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O1

void rev_fpk(kcc_joint *joint,joint_position *q,gc_pose *x)

{
  joint_axis jVar1;
  matrix3x3 *pmVar2;
  vector3 *pvVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  if (joint == (kcc_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x9c,
                  "void rev_fpk(const struct kcc_joint *, const joint_position *, struct gc_pose *)"
                 );
  }
  if (q == (joint_position *)0x0) {
    __assert_fail("q",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x9d,
                  "void rev_fpk(const struct kcc_joint *, const joint_position *, struct gc_pose *)"
                 );
  }
  if (x == (gc_pose *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x9e,
                  "void rev_fpk(const struct kcc_joint *, const joint_position *, struct gc_pose *)"
                 );
  }
  if (x->rotation != (matrix3x3 *)0x0) {
    if (x->translation == (vector3 *)0x0) {
      __assert_fail("x->translation",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                    ,0xa0,
                    "void rev_fpk(const struct kcc_joint *, const joint_position *, struct gc_pose *)"
                   );
    }
    dVar6 = cos(*q);
    dVar7 = sin(*q);
    pmVar2 = x->rotation;
    *(undefined8 *)&pmVar2->field_0 = 0;
    *(undefined8 *)((long)&pmVar2->field_0 + 8) = 0;
    *(undefined8 *)((long)&pmVar2->field_0 + 0x10) = 0;
    *(undefined8 *)((long)&pmVar2->field_0 + 0x18) = 0;
    *(undefined8 *)((long)&pmVar2->field_0 + 0x20) = 0;
    *(undefined8 *)((long)&pmVar2->field_0 + 0x28) = 0;
    *(undefined8 *)((long)&pmVar2->field_0 + 0x30) = 0;
    *(undefined8 *)((long)&pmVar2->field_0 + 0x38) = 0;
    *(undefined8 *)((long)&pmVar2->field_0 + 0x40) = 0;
    pvVar3 = x->translation;
    (pvVar3->field_0).field_0.x = 0.0;
    (pvVar3->field_0).field_0.y = 0.0;
    (pvVar3->field_0).field_0.z = 0.0;
    jVar1 = (joint->field_1).revolute_joint.axis;
    if (jVar1 == JOINT_AXIS_Z) {
      *(undefined8 *)((long)&x->rotation->field_0 + 0x40) = 0x3ff0000000000000;
      *(double *)&x->rotation->field_0 = dVar6;
      *(double *)((long)&x->rotation->field_0 + 8) = dVar7;
      dVar7 = -dVar7;
      lVar4 = 0x20;
      lVar5 = 0x18;
    }
    else if (jVar1 == JOINT_AXIS_Y) {
      *(undefined8 *)((long)&x->rotation->field_0 + 0x20) = 0x3ff0000000000000;
      *(double *)&x->rotation->field_0 = dVar6;
      *(double *)((long)&x->rotation->field_0 + 0x10) = -dVar7;
      lVar4 = 0x40;
      lVar5 = 0x30;
    }
    else {
      if (jVar1 != JOINT_AXIS_X) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                      ,0xca,
                      "void rev_fpk(const struct kcc_joint *, const joint_position *, struct gc_pose *)"
                     );
      }
      *(undefined8 *)&x->rotation->field_0 = 0x3ff0000000000000;
      *(double *)((long)&x->rotation->field_0 + 0x20) = dVar6;
      *(double *)((long)&x->rotation->field_0 + 0x28) = dVar7;
      dVar7 = -dVar7;
      lVar4 = 0x40;
      lVar5 = 0x38;
    }
    *(double *)((long)&x->rotation->field_0 + lVar5) = dVar7;
    *(double *)((long)&x->rotation->field_0 + lVar4) = dVar6;
    return;
  }
  __assert_fail("x->rotation",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x9f,
                "void rev_fpk(const struct kcc_joint *, const joint_position *, struct gc_pose *)");
}

Assistant:

static void rev_fpk(
        const struct kcc_joint *joint,
        const joint_position *q,
        struct gc_pose *x)
{
    assert(joint);
    assert(q);
    assert(x);
    assert(x->rotation);
    assert(x->translation);

    double cq = cos(q[0]);
    double sq = sin(q[0]);

    // initialize all rotation matrix and position vector to 0.0
    memset(x->rotation, 0, sizeof(*x->rotation));
    memset(x->translation, 0, sizeof(*x->translation));

    // Note that the rotation for spatial transforms is inverted when compared
    // to homogeneous transforms!
    if (joint->revolute_joint.axis == JOINT_AXIS_X) {
        // |1  0  0 |
        // |0  cq sq|
        // |0 -sq cq|

        x->rotation->row_x.x = 1.0;
        x->rotation->row_y.y =  cq;
        x->rotation->row_y.z =  sq;
        x->rotation->row_z.y = -sq;
        x->rotation->row_z.z =  cq;
    } else if (joint->revolute_joint.axis == JOINT_AXIS_Y) {
        // | cq 0 -sq|
        // | 0  1  0 |
        // | sq 0  cq|

        x->rotation->row_y.y = 1.0;
        x->rotation->row_x.x =  cq;
        x->rotation->row_x.z = -sq;
        x->rotation->row_z.x =  sq;
        x->rotation->row_z.z =  cq;
    } else if (joint->revolute_joint.axis == JOINT_AXIS_Z) {
        // | cq sq 0|
        // |-sq cq 0|
        // | 0  0  1|

        x->rotation->row_z.z = 1.0;
        x->rotation->row_x.x =  cq;
        x->rotation->row_x.y =  sq;
        x->rotation->row_y.x = -sq;
        x->rotation->row_y.y =  cq;
    } else {
        assert(0);
    }
}